

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

InterfaceHandle __thiscall helics::CommonCore::getTranslator(CommonCore *this,string_view name)

{
  BaseType BVar1;
  BasicHandleInfo *pBVar2;
  shared_lock<std::shared_mutex> local_28;
  
  local_28._M_pm = &(this->handles).m_mutex;
  local_28._M_owns = true;
  std::__shared_mutex_pthread::lock_shared(&(local_28._M_pm)->_M_impl);
  pBVar2 = HandleManager::getInterfaceHandle(&(this->handles).m_obj,name,TRANSLATOR);
  std::shared_lock<std::shared_mutex>::~shared_lock(&local_28);
  BVar1 = -1700000000;
  if ((pBVar2 != (BasicHandleInfo *)0x0) && (pBVar2->handleType == TRANSLATOR)) {
    BVar1 = (pBVar2->handle).handle.hid;
  }
  return (InterfaceHandle)BVar1;
}

Assistant:

InterfaceHandle CommonCore::getTranslator(std::string_view name) const
{
    const auto* trans = handles.read(
        [&name](auto& hand) { return hand.getInterfaceHandle(name, InterfaceType::TRANSLATOR); });
    if ((trans != nullptr) && (trans->handleType == InterfaceType::TRANSLATOR)) {
        return trans->getInterfaceHandle();
    }
    return {};
}